

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lua_Unsigned luaH_getn(Table *t)

{
  LuaType LVar1;
  ulong uVar2;
  TValue *pTVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  lua_Unsigned lVar8;
  
  uVar5 = t->sizearray;
  uVar6 = (ulong)uVar5;
  if ((uVar6 == 0) || (t->array[uVar5 - 1].tt_ != 0)) {
    uVar7 = uVar6;
    if (t->lastfree != (Node *)0x0) {
      pTVar3 = luaH_getint(t,uVar6 + 1);
      LVar1 = pTVar3->tt_;
      uVar7 = uVar6 + 1;
      while (uVar2 = uVar7, LVar1 != 0) {
        if (uVar2 >> 0x3e != 0) {
          lVar8 = 0xffffffffffffffff;
          do {
            pTVar3 = luaH_getint(t,lVar8 + 2);
            lVar8 = lVar8 + 1;
          } while (pTVar3->tt_ != 0);
          return lVar8;
        }
        pTVar3 = luaH_getint(t,uVar2 * 2);
        uVar7 = uVar2 * 2;
        uVar6 = uVar2;
        LVar1 = pTVar3->tt_;
      }
      uVar4 = uVar2 - uVar6;
      while (uVar7 = uVar6, 1 < uVar4) {
        uVar7 = uVar2 + uVar6 >> 1;
        pTVar3 = luaH_getint(t,uVar7);
        if (pTVar3->tt_ != 0) {
          uVar6 = uVar7;
          uVar7 = uVar2;
        }
        uVar2 = uVar7;
        uVar4 = uVar7 - uVar6;
      }
    }
  }
  else {
    uVar7 = 0;
    if (uVar5 != 1) {
      do {
        uVar5 = (uint)((int)uVar7 + (int)uVar6) >> 1;
        if (t->array[uVar5 - 1].tt_ == 0) {
          uVar6 = (ulong)uVar5;
        }
        else {
          uVar7 = (ulong)uVar5;
        }
      } while (1 < (uint)((int)uVar6 - (int)uVar7));
    }
  }
  return uVar7;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int j;
  j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}